

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

mapped_type * __thiscall
eastl::
hash_map<eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_false>
::operator[](hash_map<eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_false>
             *this,key_type *key)

{
  node_type **x;
  bool bVar1;
  reference ppVar2;
  basic_string<char,_eastl::allocator> local_b8;
  pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>
  local_98;
  insert_return_type local_58;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  iterator it;
  key_type *key_local;
  hash_map<eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_false>
  *this_local;
  
  it.
  super_hashtable_iterator_base<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
  .mpBucket = (node_type **)key;
  hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
  ::find((hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
          *)local_30,(key_type *)this);
  hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
  ::end((hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
         *)local_40);
  bVar1 = operator!=((hashtable_iterator_base<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
                      *)local_30,
                     (hashtable_iterator_base<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
                      *)local_40);
  x = it.
      super_hashtable_iterator_base<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
      .mpBucket;
  if (bVar1) {
    ppVar2 = hashtable_iterator<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false,_false>
             ::operator*((hashtable_iterator<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false,_false>
                          *)local_30);
  }
  else {
    basic_string<char,_eastl::allocator>::basic_string(&local_b8);
    pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>
    ::pair(&local_98,(basic_string<char,_eastl::allocator> *)x,&local_b8);
    hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
    ::insert(&local_58,
             &this->
              super_hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
             ,&local_98);
    ppVar2 = hashtable_iterator<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false,_false>
             ::operator*(&local_58.first);
    pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>
    ::~pair(&local_98);
    basic_string<char,_eastl::allocator>::~basic_string(&local_b8);
  }
  this_local = (hash_map<eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_false>
                *)&ppVar2->second;
  return (mapped_type *)this_local;
}

Assistant:

mapped_type& operator[](const key_type& key)
        {
            const typename base_type::iterator it = base_type::find(key);
            if(it != base_type::end())
                return (*it).second;
            return (*base_type::insert(value_type(key, mapped_type())).first).second;
        }